

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

void vkt::shaderexecutor::anon_unknown_0::generateFragShaderOutAssign
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,string *valuePrefix,
               string *outputPrefix)

{
  int iVar1;
  DataType DVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  pointer pSVar5;
  int iVar6;
  
  for (pSVar5 = (shaderSpec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 != (shaderSpec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
    DVar2 = (pSVar5->varType).m_data.basic.type;
    if (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9) {
      iVar1 = glu::getDataTypeMatrixNumColumns(DVar2);
      iVar6 = 0;
      if (iVar1 < 1) {
        iVar1 = iVar6;
      }
      for (; iVar1 != iVar6; iVar6 = iVar6 + 1) {
        poVar3 = std::operator<<(src,"\t");
        poVar3 = std::operator<<(poVar3,(string *)valuePrefix);
        poVar3 = std::operator<<(poVar3,(string *)pSVar5);
        poVar3 = std::operator<<(poVar3,"_");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = std::operator<<(poVar3,(string *)CONCAT71(in_register_00000011,useIntOutputs));
        poVar3 = std::operator<<(poVar3,(string *)pSVar5);
        poVar3 = std::operator<<(poVar3,"[");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
        std::operator<<(poVar3,"];\n");
      }
    }
    else {
      if (DVar2 - TYPE_BOOL < 4) {
        iVar1 = glu::getDataTypeScalarSize(DVar2);
        DVar2 = TYPE_INT;
        if (1 < iVar1) {
          DVar2 = glu::getDataTypeIntVec(iVar1);
        }
        poVar3 = std::operator<<(src,"\t");
        poVar3 = std::operator<<(poVar3,(string *)valuePrefix);
        poVar3 = std::operator<<(poVar3,(string *)pSVar5);
        poVar3 = std::operator<<(poVar3," = ");
        pcVar4 = glu::getDataTypeName(DVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"(");
        pcVar4 = ");\n";
      }
      else {
        poVar3 = std::operator<<(src,"\t");
        poVar3 = std::operator<<(poVar3,(string *)valuePrefix);
        poVar3 = std::operator<<(poVar3,(string *)pSVar5);
        poVar3 = std::operator<<(poVar3," = ");
        pcVar4 = ";\n";
      }
      poVar3 = std::operator<<(poVar3,(string *)CONCAT71(in_register_00000011,useIntOutputs));
      poVar3 = std::operator<<(poVar3,(string *)pSVar5);
      std::operator<<(poVar3,pcVar4);
    }
  }
  return;
}

Assistant:

static void generateFragShaderOutAssign (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::string& valuePrefix, const std::string& outputPrefix)
{
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (useIntOutputs && glu::isDataTypeFloatOrVec(output->varType.getBasicType()))
			src << "	o_" << output->name << " = floatBitsToUint(" << valuePrefix << output->name << ");\n";
		else if (glu::isDataTypeMatrix(output->varType.getBasicType()))
		{
			const int	numVecs		= glu::getDataTypeMatrixNumColumns(output->varType.getBasicType());

			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
				if (useIntOutputs)
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = floatBitsToUint(" << valuePrefix << output->name << "[" << vecNdx << "]);\n";
				else
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = " << valuePrefix << output->name << "[" << vecNdx << "];\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

			src << "\t" << outputPrefix << output->name << " = " << glu::getDataTypeName(intBaseType) << "(" << valuePrefix << output->name << ");\n";
		}
		else
			src << "\t" << outputPrefix << output->name << " = " << valuePrefix << output->name << ";\n";
	}
}